

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

Result<std::shared_ptr<wasm::Module>_> * __thiscall
Shell::makeModule(Result<std::shared_ptr<wasm::Module>_> *__return_storage_ptr__,Shell *this,
                 WASTModule *mod)

{
  element_type *peVar1;
  FeatureSet local_6d4;
  add_pointer_t<std::shared_ptr<wasm::Module>_> local_6d0;
  type *ptr;
  stringstream ss;
  ParseException *p;
  WasmBinaryReader local_510 [8];
  WasmBinaryReader reader;
  allocator_type local_119;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined1 local_108 [8];
  vector<char,_std::allocator<char>_> buffer;
  Err local_e8;
  Err *local_c8;
  Err *err;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  Result<wasm::Ok> _val;
  shared_ptr<wasm::Module> local_48;
  add_pointer_t<wasm::WATParser::QuotedModule> local_38;
  type *quoted;
  shared_ptr<wasm::Module> wasm;
  WASTModule *mod_local;
  Shell *this_local;
  
  wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod;
  std::shared_ptr<wasm::Module>::shared_ptr((shared_ptr<wasm::Module> *)&quoted);
  local_38 = std::
             get_if<wasm::WATParser::QuotedModule,wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>
                       ((variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_> *)
                        wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
  if (local_38 == (add_pointer_t<wasm::WATParser::QuotedModule>)0x0) {
    local_6d0 = std::
                get_if<std::shared_ptr<wasm::Module>,wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>
                          ((variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_> *
                           )wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
    if (local_6d0 == (add_pointer_t<std::shared_ptr<wasm::Module>_>)0x0) {
      ::wasm::handle_unreachable
                ("unexpected module kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                 ,0x78);
    }
    std::shared_ptr<wasm::Module>::operator=((shared_ptr<wasm::Module> *)&quoted,local_6d0);
  }
  else {
    std::make_shared<wasm::Module>();
    std::shared_ptr<wasm::Module>::operator=((shared_ptr<wasm::Module> *)&quoted,&local_48);
    std::shared_ptr<wasm::Module>::~shared_ptr(&local_48);
    if (local_38->type == Text) {
      peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&quoted);
      local_90 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)&local_38->module);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      ::wasm::WATParser::parseModule(local_80,peVar1,local_90._0_8_,local_90._8_8_,&local_b8);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_b8);
      local_c8 = ::wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_80);
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_1_ = local_c8 != (Err *)0x0
      ;
      if ((bool)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_1_) {
        ::wasm::Err::Err(&local_e8,local_c8);
        ::wasm::Result<std::shared_ptr<wasm::Module>_>::Result(__return_storage_ptr__,&local_e8);
        ::wasm::Err::~Err(&local_e8);
      }
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._21_3_ = 0;
      ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_80);
      if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 0)
      goto LAB_0019a5ac;
    }
    else if (local_38->type == Binary) {
      local_110._M_current = (char *)std::__cxx11::string::begin();
      local_118._M_current = (char *)std::__cxx11::string::end();
      std::allocator<char>::allocator();
      std::vector<char,std::allocator<char>>::
      vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<char,std::allocator<char>> *)local_108,local_110,local_118,&local_119);
      std::allocator<char>::~allocator(&local_119);
      peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&quoted);
      ::wasm::FeatureSet::FeatureSet((FeatureSet *)((long)&p + 4),0x3fffff);
      ::wasm::WasmBinaryReader::WasmBinaryReader
                (local_510,peVar1,p._4_4_,(vector *)local_108,
                 (vector *)&::wasm::defaultEmptySourceMap);
      ::wasm::WasmBinaryReader::read();
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 2;
      ::wasm::WasmBinaryReader::~WasmBinaryReader(local_510);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_108);
      if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 2)
      goto LAB_0019a5ac;
    }
  }
  ::wasm::FeatureSet::FeatureSet(&local_6d4,0x3fffff);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&quoted);
  (peVar1->features).features = local_6d4.features;
  ::wasm::Result<std::shared_ptr<wasm::Module>>::Result<std::shared_ptr<wasm::Module>>
            ((Result<std::shared_ptr<wasm::Module>> *)__return_storage_ptr__,
             (shared_ptr<wasm::Module> *)&quoted);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
LAB_0019a5ac:
  std::shared_ptr<wasm::Module>::~shared_ptr((shared_ptr<wasm::Module> *)&quoted);
  return __return_storage_ptr__;
}

Assistant:

Result<std::shared_ptr<Module>> makeModule(WASTModule& mod) {
    std::shared_ptr<Module> wasm;
    if (auto* quoted = std::get_if<QuotedModule>(&mod)) {
      wasm = std::make_shared<Module>();
      switch (quoted->type) {
        case QuotedModuleType::Text: {
          CHECK_ERR(parseModule(*wasm, quoted->module));
          break;
        }
        case QuotedModuleType::Binary: {
          std::vector<char> buffer(quoted->module.begin(),
                                   quoted->module.end());
          WasmBinaryReader reader(*wasm, FeatureSet::All, buffer);
          try {
            reader.read();
          } catch (ParseException& p) {
            std::stringstream ss;
            p.dump(ss);
            return Err{ss.str()};
          }
          break;
        }
      }
    } else if (auto* ptr = std::get_if<std::shared_ptr<Module>>(&mod)) {
      wasm = *ptr;
    } else {
      WASM_UNREACHABLE("unexpected module kind");
    }
    wasm->features = FeatureSet::All;
    return wasm;
  }